

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O3

Amount cfd::core::ConfidentialValue::ConvertFromConfidentialValue(ByteData *value)

{
  undefined1 auVar1 [12];
  CfdException *this;
  Amount AVar2;
  int ret;
  uint64_t satoshi;
  int local_64;
  uint64_t local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  undefined1 local_40 [32];
  
  ByteData::GetBytes(&local_58,value);
  local_60 = 0;
  local_64 = wally_tx_confidential_value_to_satoshi
                       (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_58.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_58.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,&local_60);
  if (local_64 == 0) {
    AVar2 = Amount::CreateBySatoshiAmount(local_60);
    if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    auVar1 = AVar2._0_12_;
    AVar2._12_4_ = 0;
    AVar2.amount_ = auVar1._0_8_;
    AVar2.ignore_check_ = (bool)auVar1[8];
    AVar2._9_3_ = auVar1._9_3_;
    return AVar2;
  }
  local_40._0_8_ = "cfdcore_elements_transaction.cpp";
  local_40._8_4_ = 0x297;
  local_40._16_8_ = "ConvertFromConfidentialValue";
  logger::log<int&>((CfdSourceLocation *)local_40,kCfdLogLevelWarning,
                    "wally_tx_confidential_value_to_satoshi NG[{}].",&local_64);
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_40._0_8_ = local_40 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"convert from confidential value error.","");
  CfdException::CfdException(this,kCfdIllegalStateError,(string *)local_40);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

Amount ConfidentialValue::ConvertFromConfidentialValue(  // force LF
    const ByteData &value) {
  const std::vector<uint8_t> &buffer = value.GetBytes();
  uint64_t satoshi = 0;
  int ret = wally_tx_confidential_value_to_satoshi(
      buffer.data(), buffer.size(), &satoshi);
  if (ret != WALLY_OK) {
    warn(
        CFD_LOG_SOURCE, "wally_tx_confidential_value_to_satoshi NG[{}].", ret);
    throw CfdException(
        kCfdIllegalStateError, "convert from confidential value error.");
  }
  return Amount::CreateBySatoshiAmount(static_cast<int64_t>(satoshi));
}